

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O3

void Resmpl_Exec_LinearUp(RESMPL_STATE *CAA,UINT32 length,WAVE_32BS *retSample)

{
  int iVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  UINT32 UVar11;
  ulong uVar12;
  ulong uVar13;
  UINT32 UVar14;
  uint uVar15;
  ulong uVar16;
  DEV_SMPL *StreamPnt [2];
  DEV_SMPL *local_48;
  DEV_SMPL *local_40;
  
  uVar10 = CAA->smpRateSrc;
  if (length == 0) {
    uVar5 = CAA->smpLast;
  }
  else {
    uVar8 = CAA->smpP;
    uVar16 = 0;
    UVar14 = CAA->smpNext;
    do {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (ulong)uVar8 * (ulong)uVar10 * 0x800;
      auVar4 = auVar4 / ZEXT416(CAA->smpRateDst);
      uVar6 = auVar4._0_8_;
      iVar7 = auVar4._0_4_;
      uVar15 = iVar7 + 0x7ffU >> 0xb;
      Resmpl_EnsureBuffers(CAA,(uVar15 - UVar14) + 2);
      pDVar2 = CAA->smplBufs[0];
      pDVar3 = CAA->smplBufs[1];
      *pDVar2 = (CAA->lSmpl).L;
      *pDVar3 = (CAA->lSmpl).R;
      pDVar2[1] = (CAA->nSmpl).L;
      pDVar3[1] = (CAA->nSmpl).R;
      UVar11 = uVar15 - CAA->smpNext;
      UVar14 = uVar15;
      if (UVar11 != 0) {
        local_48 = pDVar2 + 2;
        local_40 = pDVar3 + 2;
        (*CAA->StreamUpdate)(CAA->su_DataPtr,UVar11,&local_48);
        UVar14 = CAA->smpNext;
      }
      uVar5 = (uint)(uVar6 >> 0xb) & 0x1fffff;
      iVar7 = iVar7 + UVar14 * -0x800;
      CAA->smpLast = uVar5;
      CAA->smpNext = uVar15;
      uVar6 = uVar6 & 0x7ff;
      uVar9 = iVar7 + 0x800U >> 0xb;
      uVar8 = iVar7 + 0xfffU >> 0xb;
      iVar7 = pDVar3[uVar9];
      iVar1 = pDVar3[uVar8];
      uVar12 = (long)CAA->volumeL *
               ((long)pDVar2[uVar8] * uVar6 + (long)pDVar2[uVar9] * (0x800 - uVar6));
      uVar13 = uVar12 + 0x7ff;
      if (-1 < (long)uVar12) {
        uVar13 = uVar12;
      }
      retSample[uVar16].L = retSample[uVar16].L + (int)(uVar13 >> 0xb);
      uVar13 = (long)CAA->volumeR * ((long)iVar1 * uVar6 + (long)iVar7 * (0x800 - uVar6));
      uVar6 = uVar13 + 0x7ff;
      if (-1 < (long)uVar13) {
        uVar6 = uVar13;
      }
      retSample[uVar16].R = retSample[uVar16].R + (int)(uVar6 >> 0xb);
      (CAA->lSmpl).L = pDVar2[uVar9];
      (CAA->lSmpl).R = pDVar3[uVar9];
      (CAA->nSmpl).L = pDVar2[uVar8];
      (CAA->nSmpl).R = pDVar3[uVar8];
      uVar8 = CAA->smpP + 1;
      CAA->smpP = uVar8;
      uVar16 = uVar16 + 1;
      UVar14 = uVar15;
    } while (length != uVar16);
    uVar10 = CAA->smpRateSrc;
  }
  if (uVar10 <= uVar5) {
    CAA->smpLast = uVar5 - uVar10;
    CAA->smpNext = CAA->smpNext - uVar10;
    CAA->smpP = CAA->smpP - CAA->smpRateDst;
  }
  return;
}

Assistant:

static void Resmpl_Exec_LinearUp(RESMPL_STATE* CAA, UINT32 length, WAVE_32BS* retSample)
{
	// RESALGO_LINEAR_UP: Linear Upsampling
	DEV_SMPL* CurBufL;
	DEV_SMPL* CurBufR;
	DEV_SMPL* StreamPnt[0x02];
	UINT32 InBase;
	UINT32 InPos;
	UINT32 OutPos;
	UINT32 SmpFrc;	// Sample Fraction
	UINT32 InPre;
	UINT32 InNow;
	SLINT InPosL;
	INT64 TempSmpL;
	INT64 TempSmpR;
	INT32 SmpCnt;	// must be signed, else I'm getting calculation errors
	UINT64 ChipSmpRateFP;
	
	ChipSmpRateFP = FIXPNT_FACT * (UINT64)CAA->smpRateSrc;
	// TODO: Make it work *properly* with large blocks. (this is very hackish)
	for (OutPos = 0; OutPos < length; OutPos ++)
	{
		InPosL = (SLINT)(CAA->smpP * ChipSmpRateFP / CAA->smpRateDst);
		InPre = (UINT32)fp2i_floor(InPosL);
		InNow = (UINT32)fp2i_ceil(InPosL);
		
		Resmpl_EnsureBuffers(CAA, InNow - CAA->smpNext + 2);
		CurBufL = CAA->smplBufs[0];
		CurBufR = CAA->smplBufs[1];
		
		CurBufL[0] = CAA->lSmpl.L;
		CurBufR[0] = CAA->lSmpl.R;
		CurBufL[1] = CAA->nSmpl.L;
		CurBufR[1] = CAA->nSmpl.R;
		if (InNow != CAA->smpNext)
		{
			StreamPnt[0] = &CurBufL[2];
			StreamPnt[1] = &CurBufR[2];
			CAA->StreamUpdate(CAA->su_DataPtr, InNow - CAA->smpNext, StreamPnt);
		}
		
		InBase = FIXPNT_FACT + (UINT32)(InPosL - (SLINT)CAA->smpNext * FIXPNT_FACT);
		SmpCnt = FIXPNT_FACT;
		CAA->smpLast = InPre;
		CAA->smpNext = InNow;
		//for (OutPos = 0; OutPos < length; OutPos ++)
		//{
		//InPos = InBase + (UINT32)(OutPos * ChipSmpRateFP / CAA->smpRateDst);
		InPos = InBase;
		
		InPre = fp2i_floor(InPos);
		InNow = fp2i_ceil(InPos);
		SmpFrc = getfraction(InPos);
		
		// Linear interpolation
		TempSmpL = ((INT64)CurBufL[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufL[InNow] * SmpFrc);
		TempSmpR = ((INT64)CurBufR[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufR[InNow] * SmpFrc);
		retSample[OutPos].L += (INT32)(TempSmpL * CAA->volumeL / SmpCnt);
		retSample[OutPos].R += (INT32)(TempSmpR * CAA->volumeR / SmpCnt);
		//}
		CAA->lSmpl.L = CurBufL[InPre];
		CAA->lSmpl.R = CurBufR[InPre];
		CAA->nSmpl.L = CurBufL[InNow];
		CAA->nSmpl.R = CurBufR[InNow];
		CAA->smpP ++;
	}
	
	if (CAA->smpLast >= CAA->smpRateSrc)
	{
		CAA->smpLast -= CAA->smpRateSrc;
		CAA->smpNext -= CAA->smpRateSrc;
		CAA->smpP -= CAA->smpRateDst;
	}
	
	return;
}